

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O1

void write_local_cert(scep *s)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  X509_NAME *pXVar4;
  char *pcVar5;
  char *pcVar6;
  X509_NAME *b;
  FILE *pFVar7;
  FILE *pFVar8;
  BIO *bp;
  PKCS7 *pPVar9;
  X509 *pXVar10;
  X509_EXTENSION *pXVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uVar14;
  X509 *unaff_RBP;
  long lVar15;
  FILE *pFVar16;
  int *piVar17;
  X509 *unaff_R13;
  char **unaff_R14;
  ulong uVar18;
  FILE *unaff_R15;
  char **ppcVar19;
  char buffer [1024];
  char cert_buf [1024];
  char buffer_1 [1024];
  uint uStack_1d14;
  PKCS7 *pPStack_1d10;
  BIO *pBStack_1d08;
  long lStack_1d00;
  byte abStack_1cf8 [64];
  char acStack_1cb8 [1024];
  char acStack_18b8 [1032];
  X509 *pXStack_14b0;
  int *piStack_14a8;
  X509 *pXStack_14a0;
  FILE *pFStack_1498;
  FILE *pFStack_1490;
  X509 *pXStack_1488;
  FILE *pFStack_1478;
  FILE aFStack_1470 [4];
  FILE *pFStack_1068;
  int *piStack_1060;
  X509 *pXStack_1058;
  FILE *pFStack_1050;
  FILE *pFStack_1048;
  X509 *pXStack_1040;
  X509 aXStack_1038 [5];
  X509 local_c38 [5];
  char local_838 [2056];
  
  localcert = (X509 *)0x0;
  pFVar8 = (FILE *)((s->reply_p7->d).data)->flags;
  piVar17 = &v_flag;
  if (v_flag != 0) {
    pXStack_1040 = (X509 *)0x10dab3;
    uVar2 = OPENSSL_sk_num(pFVar8);
    pXStack_1040 = (X509 *)0x10dac3;
    printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar2);
  }
  pXStack_1040 = (X509 *)0x10dacb;
  pFVar16 = pFVar8;
  iVar3 = OPENSSL_sk_num();
  pXVar10 = (X509 *)localcert;
  if (0 < iVar3) {
    unaff_R14 = (char **)0x0;
    do {
      pXStack_1040 = (X509 *)0x10dae1;
      unaff_R13 = (X509 *)OPENSSL_sk_value(pFVar8,unaff_R14);
      pcVar6 = pname;
      if (v_flag != 0) {
        pXStack_1040 = (X509 *)0x10db01;
        pXVar4 = X509_get_subject_name(unaff_R13);
        pXStack_1040 = (X509 *)0x10db14;
        pcVar5 = X509_NAME_oneline(pXVar4,(char *)aXStack_1038,0x400);
        pXStack_1040 = (X509 *)0x10db28;
        printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar6,pcVar5);
        pXStack_1040 = (X509 *)0x10db30;
        pXVar4 = X509_get_issuer_name(unaff_R13);
        pXStack_1040 = (X509 *)0x10db40;
        pcVar6 = X509_NAME_oneline(pXVar4,(char *)aXStack_1038,0x400);
        pXStack_1040 = (X509 *)0x10db51;
        printf("  issuer: %s\n",pcVar6);
        pXStack_1040 = (X509 *)0x10db5d;
        pXVar4 = (X509_NAME *)X509_REQ_get_subject_name(request);
        pXStack_1040 = (X509 *)0x10db6d;
        pcVar6 = X509_NAME_oneline(pXVar4,(char *)aXStack_1038,0x400);
        pXStack_1040 = (X509 *)0x10db7e;
        printf("  request_subject: \'%s\'\n",pcVar6);
        unaff_RBP = aXStack_1038;
      }
      pXStack_1040 = (X509 *)0x10db86;
      pXVar4 = X509_get_subject_name(unaff_R13);
      pXStack_1040 = (X509 *)0x10db95;
      b = (X509_NAME *)X509_REQ_get_subject_name(request);
      pXStack_1040 = (X509 *)0x10dba0;
      iVar3 = X509_NAME_cmp(pXVar4,b);
      if (d_flag != 0) {
        pXStack_1040 = (X509 *)0x10dc81;
        write_local_cert_cold_1();
      }
      if (iVar3 == 0) {
LAB_0010dc26:
        if (v_flag != 0) {
          pXStack_1040 = (X509 *)0x10dc39;
          puts("CN\'s of request and certificate matched!");
        }
      }
      else {
        pXStack_1040 = (X509 *)0x10dbc0;
        pXVar4 = X509_get_subject_name(unaff_R13);
        pXStack_1040 = (X509 *)0x10dbd8;
        X509_NAME_oneline(pXVar4,local_838,0x400);
        pXStack_1040 = (X509 *)0x10dbe4;
        pXVar4 = (X509_NAME *)X509_REQ_get_subject_name(request);
        unaff_RBP = local_c38;
        pXStack_1040 = (X509 *)0x10dbfc;
        X509_NAME_oneline(pXVar4,(char *)unaff_RBP,0x400);
        if (v_flag != 0) {
          pXStack_1040 = (X509 *)0x10dc17;
          printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n",
                 unaff_RBP,local_838);
        }
        pXStack_1040 = (X509 *)0x10dc22;
        iVar3 = strcmp(local_838,(char *)unaff_RBP);
        if (iVar3 == 0) goto LAB_0010dc26;
        pXStack_1040 = (X509 *)0x10dc8b;
        write_local_cert_cold_2();
      }
      pXStack_1040 = (X509 *)0x10dc41;
      unaff_R15 = (FILE *)X509_get_subject_name(unaff_R13);
      pXStack_1040 = (X509 *)0x10dc4c;
      pXVar4 = X509_get_issuer_name(unaff_R13);
      pXStack_1040 = (X509 *)0x10dc57;
      pFVar16 = unaff_R15;
      iVar3 = X509_NAME_cmp((X509_NAME *)unaff_R15,pXVar4);
      pXVar10 = unaff_R13;
      if (iVar3 != 0) break;
      uVar2 = (int)unaff_R14 + 1;
      unaff_R14 = (char **)(ulong)uVar2;
      pXStack_1040 = (X509 *)0x10dc66;
      pFVar16 = pFVar8;
      iVar3 = OPENSSL_sk_num();
      pXVar10 = (X509 *)localcert;
    } while ((int)uVar2 < iVar3);
  }
  localcert = (X509 *)pXVar10;
  if (localcert == (X509 *)0x0) {
    pXStack_1040 = (X509 *)0x10dd37;
    write_local_cert_cold_5();
LAB_0010dd37:
    pXStack_1040 = (X509 *)0x10dd3c;
    write_local_cert_cold_4();
  }
  else {
    unaff_R14 = &l_char;
    pXStack_1040 = (X509 *)0x10dcb8;
    pFVar16 = (FILE *)l_char;
    pFVar7 = fopen(l_char,"w");
    if (pFVar7 == (FILE *)0x0) goto LAB_0010dd37;
    if (v_flag != 0) {
      pXStack_1040 = (X509 *)0x10dce2;
      printf("%s: certificate written as %s\n",pname,l_char);
    }
    if (d_flag != 0) {
      pXStack_1040 = (X509 *)0x10dd04;
      PEM_write_X509(_stdout,(X509 *)localcert);
    }
    pXStack_1040 = (X509 *)0x10dd13;
    pFVar16 = pFVar7;
    iVar3 = PEM_write_X509(pFVar7,(X509 *)localcert);
    pFVar8 = pFVar7;
    if (iVar3 == 1) {
      pXStack_1040 = (X509 *)0x10dd20;
      fclose(pFVar7);
      return;
    }
  }
  pXStack_1040 = (X509 *)write_other_cert;
  write_local_cert_cold_3();
  piStack_1060 = &v_flag;
  ppcVar19 = *(char ***)(*(long *)(pFVar16->__pad5 + 0x20) + 0x10);
  pXStack_1488 = (X509 *)0x10dd6e;
  pFVar7 = (FILE *)ppcVar19;
  pFStack_1478 = pFVar16;
  pFStack_1068 = pFVar8;
  pXStack_1058 = unaff_R13;
  pFStack_1050 = (FILE *)unaff_R14;
  pFStack_1048 = unaff_R15;
  pXStack_1040 = unaff_RBP;
  iVar3 = OPENSSL_sk_num();
  pXVar10 = (X509 *)0x0;
  if (0 < iVar3) {
    unaff_R13 = (X509 *)0x0;
    do {
      pXStack_1488 = (X509 *)0x10dd86;
      unaff_RBP = (X509 *)OPENSSL_sk_value(ppcVar19,unaff_R13);
      pcVar6 = pname;
      if (v_flag != 0) {
        pXStack_1488 = (X509 *)0x10dda7;
        pXVar4 = X509_get_subject_name(unaff_RBP);
        unaff_R14 = (char **)aFStack_1470;
        pXStack_1488 = (X509 *)0x10ddbc;
        pcVar5 = X509_NAME_oneline(pXVar4,(char *)unaff_R14,0x400);
        pXStack_1488 = (X509 *)0x10ddd0;
        printf("%s: found certificate with\n  subject: %s\n",pcVar6,pcVar5);
        pXStack_1488 = (X509 *)0x10ddd8;
        pXVar4 = X509_get_issuer_name(unaff_RBP);
        pXStack_1488 = (X509 *)0x10dde8;
        pcVar5 = X509_NAME_oneline(pXVar4,(char *)unaff_R14,0x400);
        pXStack_1488 = (X509 *)0x10ddf9;
        printf("  issuer: %s\n",pcVar5);
        piVar17 = (int *)pcVar6;
      }
      pXStack_1488 = (X509 *)0x10de01;
      pFVar7 = (FILE *)X509_get_serialNumber(unaff_RBP);
      pXStack_1488 = (X509 *)0x10de19;
      iVar3 = ASN1_INTEGER_cmp((ASN1_INTEGER *)pFVar7,
                               *(ASN1_INTEGER **)((long)pFStack_1478->__pad3 + 8));
      pXVar10 = unaff_RBP;
      if (iVar3 == 0) break;
      uVar2 = (int)unaff_R13 + 1;
      unaff_R13 = (X509 *)(ulong)uVar2;
      pXStack_1488 = (X509 *)0x10de2c;
      pFVar7 = (FILE *)ppcVar19;
      iVar3 = OPENSSL_sk_num();
      pXVar10 = (X509 *)0x0;
    } while ((int)uVar2 < iVar3);
  }
  if (pXVar10 == (X509 *)0x0) {
    pXStack_1488 = (X509 *)0x10ded0;
    write_other_cert_cold_3();
  }
  else {
    ppcVar19 = &w_char;
    pXStack_1488 = (X509 *)0x10de54;
    pFVar7 = (FILE *)w_char;
    pFVar8 = fopen(w_char,"w");
    if (pFVar8 != (FILE *)0x0) {
      if (v_flag != 0) {
        pXStack_1488 = (X509 *)0x10de83;
        printf("%s: certificate written as %s\n",pname,w_char);
      }
      if (d_flag != 0) {
        pXStack_1488 = (X509 *)0x10dea1;
        PEM_write_X509(_stdout,pXVar10);
      }
      pXStack_1488 = (X509 *)0x10deac;
      pFVar7 = pFVar8;
      iVar3 = PEM_write_X509(pFVar8,pXVar10);
      unaff_R14 = (char **)pFVar8;
      if (iVar3 == 1) {
        pXStack_1488 = (X509 *)0x10deb9;
        fclose(pFVar8);
        return;
      }
      goto LAB_0010ded5;
    }
  }
  pXStack_1488 = (X509 *)0x10ded5;
  write_other_cert_cold_2();
LAB_0010ded5:
  pXStack_1488 = (X509 *)write_ca_ra;
  write_other_cert_cold_1();
  pXStack_14b0 = pXVar10;
  piStack_14a8 = piVar17;
  pXStack_14a0 = unaff_R13;
  pFStack_1498 = (FILE *)unaff_R14;
  pFStack_1490 = (FILE *)ppcVar19;
  pXStack_1488 = unaff_RBP;
  bp = BIO_new_mem_buf(pFVar7->_IO_read_end,*(int *)&pFVar7->_IO_read_base);
  pPVar9 = d2i_PKCS7_bio(bp,(PKCS7 **)0x0);
  if (pPVar9 == (PKCS7 *)0x0) {
    pcVar6 = "%s: error reading PKCS#7 data\n";
LAB_0010df27:
    fprintf(_stderr,pcVar6,pname);
LAB_0010df31:
    ERR_print_errors_fp(_stderr);
  }
  else {
    iVar3 = OBJ_obj2nid(pPVar9->type);
    if (iVar3 == 0x16) {
      lVar15 = ((pPVar9->d).data)->flags;
      if (lVar15 != 0) {
        pPStack_1d10 = pPVar9;
        pBStack_1d08 = bp;
        iVar3 = OPENSSL_sk_num(lVar15);
        if (0 < iVar3) {
          uVar18 = 0;
          lStack_1d00 = lVar15;
          do {
            memset(acStack_1cb8,0,0x400);
            memset(acStack_18b8,0,0x400);
            pXVar10 = (X509 *)OPENSSL_sk_value(lVar15,uVar18);
            snprintf(acStack_18b8,0x400,"%s-%d",c_char,uVar18);
            pcVar6 = pname;
            if (v_flag != 0) {
              pXVar4 = X509_get_subject_name(pXVar10);
              pcVar5 = X509_NAME_oneline(pXVar4,acStack_1cb8,0x400);
              printf("\n%s: found certificate with\n  subject: %s\n",pcVar6,pcVar5);
            }
            if (v_flag != 0) {
              pXVar4 = X509_get_issuer_name(pXVar10);
              pcVar6 = X509_NAME_oneline(pXVar4,acStack_1cb8,0x400);
              printf("  issuer: %s\n",pcVar6);
            }
            iVar3 = X509_digest(pXVar10,(EVP_MD *)fp_alg,abStack_1cf8,&uStack_1d14);
            if (iVar3 == 0) goto LAB_0010df31;
            iVar3 = X509_get_ext_by_NID(pXVar10,0x57,-1);
            if (iVar3 < 0) {
              if (v_flag != 0) {
                puts("  basic constraints: (not included)");
              }
            }
            else {
              pXVar11 = X509_get_ext(pXVar10,iVar3);
              if (v_flag != 0) {
                printf("  basic constraints: ");
                X509V3_EXT_print_fp(_stdout,pXVar11,0,0);
                putchar(10);
              }
            }
            iVar3 = X509_get_ext_by_NID(pXVar10,0x53,-1);
            if (iVar3 < 0) {
              if (v_flag != 0) {
                puts("  usage: (not included)");
              }
            }
            else {
              pXVar11 = X509_get_ext(pXVar10,iVar3);
              if (v_flag != 0) {
                printf("  usage: ");
                X509V3_EXT_print_fp(_stdout,pXVar11,0,0);
                putchar(10);
              }
            }
            if (v_flag != 0) {
              iVar3 = EVP_MD_get_type(fp_alg);
              pcVar6 = OBJ_nid2sn(iVar3);
              printf("  %s fingerprint: ",pcVar6);
              uVar13 = (ulong)uStack_1d14;
              if (0 < (int)uStack_1d14) {
                uVar12 = 0;
                do {
                  uVar1 = uVar12 + 1;
                  uVar14 = 10;
                  if (uVar1 != (uVar13 & 0xffffffff)) {
                    uVar14 = 0x3a;
                  }
                  printf("%02X%c",(ulong)abStack_1cf8[uVar12],uVar14);
                  uVar13 = (ulong)(int)uStack_1d14;
                  uVar12 = uVar1;
                } while ((long)uVar1 < (long)uVar13);
              }
            }
            pFVar8 = fopen(acStack_18b8,"w");
            if (pFVar8 == (FILE *)0x0) {
              pcVar6 = "%s: cannot open cert file for writing\n";
              goto LAB_0010df71;
            }
            if (v_flag != 0) {
              printf("%s: certificate written as %s\n",pname,acStack_18b8);
            }
            if (d_flag != 0) {
              PEM_write_X509(_stdout,pXVar10);
            }
            iVar3 = PEM_write_X509(pFVar8,pXVar10);
            if (iVar3 != 1) {
              pcVar6 = "%s: error while writing certificate file\n";
              goto LAB_0010df27;
            }
            fclose(pFVar8);
            lVar15 = lStack_1d00;
            uVar2 = (int)uVar18 + 1;
            uVar18 = (ulong)uVar2;
            iVar3 = OPENSSL_sk_num(lStack_1d00);
          } while ((int)uVar2 < iVar3);
        }
        PKCS7_free(pPStack_1d10);
        BIO_free(pBStack_1d08);
        exit(0);
      }
      pcVar6 = "%s: cannot find certificates\n";
LAB_0010df71:
      fprintf(_stderr,pcVar6,pname);
    }
    else {
      printf("%s: wrong PKCS#7 type\n",pname);
    }
  }
  exit(0x5d);
}

Assistant:

void
write_local_cert(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509)		*certs;
	X509			*cert = NULL;
	FILE			*fp;
	int			i;

	localcert = NULL;

	/* Get certs */
	p7 = s->reply_p7;
	certs = p7->d.sign->cert;
       
        if (v_flag) {
		printf ("write_local_cert(): found %d cert(s)\n", sk_X509_num(certs));
        }

	/* Find cert */
	for (i = 0; i < sk_X509_num(certs); i++) {
		char buffer[1024];
		cert = sk_X509_value(certs, i);
		if (v_flag) {
			printf("%s: found certificate with\n"
				"  subject: '%s'\n", pname,
				X509_NAME_oneline(X509_get_subject_name(cert),
					buffer, sizeof(buffer)));
			printf("  issuer: %s\n", 
				X509_NAME_oneline(X509_get_issuer_name(cert),
					buffer, sizeof(buffer)));
			printf("  request_subject: '%s'\n", 
				X509_NAME_oneline(X509_REQ_get_subject_name(request),
                                        buffer, sizeof(buffer)));
		}
		/* The subject has to match that of our request */
		if (!compare_subject(cert)) {
			
			if (v_flag)
				printf ("CN's of request and certificate matched!\n");
		} else {
			fprintf(stderr, "%s: Subject of our request does not match that of the returned Certificate!\n", pname);
			//exit (SCEP_PKISTATUS_FILE);
		}
		
		/* The subject cannot be the issuer (selfsigned) */
		if (X509_NAME_cmp(X509_get_subject_name(cert),
			X509_get_issuer_name(cert))) {
				localcert = cert;
				break;
		}
	}
	if (localcert == NULL) {
		fprintf(stderr, "%s: cannot find requested certificate\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);

	}
	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, l_char, "w")))
#else
	if (!(fp = fopen(l_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open cert file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: certificate written as %s\n", pname, l_char);
	if (d_flag)
		PEM_write_X509(stdout, localcert);
	if (PEM_write_X509(fp, localcert) != 1) {
		fprintf(stderr, "%s: error while writing certificate "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	(void)fclose(fp);
}